

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O1

_Bool duckdb_je_large_ralloc_no_move
                (tsdn_t *tsdn,edata_t *edata,size_t usize_min,size_t usize_max,_Bool zero)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  arena_t *paVar4;
  _Bool _Var5;
  szind_t szind;
  ehooks_t *peVar6;
  ulong uVar7;
  size_t new_size;
  _Bool local_41;
  size_t local_40;
  arena_t *local_38;
  
  uVar7 = *(ulong *)((long)duckdb_je_sz_index2size_tab +
                    (ulong)((uint)edata->e_bits >> 0x11 & 0x7f8));
  if (((uVar7 < usize_max) &&
      ((_Var5 = large_ralloc_no_move_expand(tsdn,edata,usize_max,zero), !_Var5 ||
       (((usize_min < usize_max && (uVar7 < usize_min)) &&
        (_Var5 = large_ralloc_no_move_expand(tsdn,edata,usize_min,zero), _Var5)))))) ||
     (uVar7 <= usize_max && usize_min <= uVar7)) {
    uVar2 = (uint)edata->e_bits;
  }
  else {
    if (uVar7 <= usize_max) {
      return true;
    }
    paVar4 = (arena_t *)duckdb_je_arenas[(uint)edata->e_bits & 0xfff].repr;
    peVar6 = duckdb_je_arena_get_ehooks(paVar4);
    local_40 = *(size_t *)
                ((long)duckdb_je_sz_index2size_tab + (ulong)((uint)edata->e_bits >> 0x11 & 0x7f8));
    uVar7 = (edata->field_2).e_size_esn;
    if (*(long *)((long)(peVar6->ptr).repr + 0x38) == 0) {
      return true;
    }
    local_41 = false;
    new_size = duckdb_je_sz_large_pad + usize_max;
    local_38 = paVar4;
    if (usize_max < 0x1001) {
      szind = (szind_t)duckdb_je_sz_size2index_tab[usize_max + 7 >> 3];
    }
    else {
      szind = sz_size2index_compute(usize_max);
    }
    _Var5 = duckdb_je_pa_shrink(tsdn,&paVar4->pa_shard,edata,uVar7 & 0xfffffffffffff000,new_size,
                                szind,&local_41);
    paVar4 = local_38;
    if (_Var5) {
      return true;
    }
    if (local_41 == true) {
      duckdb_je_arena_handle_deferred_work(tsdn,local_38);
    }
    duckdb_je_arena_extent_ralloc_large_shrink(tsdn,paVar4,edata,local_40);
    if (_Var5) {
      return true;
    }
    uVar2 = (uint)edata->e_bits;
  }
  paVar4 = (arena_t *)duckdb_je_arenas[uVar2 & 0xfff].repr;
  if (tsdn != (tsdn_t *)0x0) {
    cVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar3 + -1;
    if (iVar3 < 1) {
      if (cVar1 < '\x01') {
        uVar7 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar7;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar7 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,paVar4,false,false);
        return false;
      }
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick = 0;
    }
  }
  return false;
}

Assistant:

bool
large_ralloc_no_move(tsdn_t *tsdn, edata_t *edata, size_t usize_min,
    size_t usize_max, bool zero) {
	size_t oldusize = edata_usize_get(edata);

	/* The following should have been caught by callers. */
	assert(usize_min > 0 && usize_max <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS);

	if (usize_max > oldusize) {
		/* Attempt to expand the allocation in-place. */
		if (!large_ralloc_no_move_expand(tsdn, edata, usize_max,
		    zero)) {
			arena_decay_tick(tsdn, arena_get_from_edata(edata));
			return false;
		}
		/* Try again, this time with usize_min. */
		if (usize_min < usize_max && usize_min > oldusize &&
		    large_ralloc_no_move_expand(tsdn, edata, usize_min, zero)) {
			arena_decay_tick(tsdn, arena_get_from_edata(edata));
			return false;
		}
	}

	/*
	 * Avoid moving the allocation if the existing extent size accommodates
	 * the new size.
	 */
	if (oldusize >= usize_min && oldusize <= usize_max) {
		arena_decay_tick(tsdn, arena_get_from_edata(edata));
		return false;
	}

	/* Attempt to shrink the allocation in-place. */
	if (oldusize > usize_max) {
		if (!large_ralloc_no_move_shrink(tsdn, edata, usize_max)) {
			arena_decay_tick(tsdn, arena_get_from_edata(edata));
			return false;
		}
	}
	return true;
}